

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_enc.c
# Opt level: O1

int jp2_encode(jas_image_t *image,jas_stream_t *out,char *optstr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  jp2_box_t *box;
  jas_stream_t *out_00;
  uint_fast8_t *puVar4;
  ulong uVar5;
  jas_iccprof_t *prof;
  jas_stream_t *out_01;
  jas_image_cmpt_t **ppjVar6;
  jp2_cdefchan_t *pjVar7;
  uint_fast32_t uVar8;
  long lVar9;
  char *pcVar10;
  uint_fast16_t uVar11;
  uint uVar12;
  jas_image_cmpt_t *pjVar13;
  uint_fast16_t *puVar14;
  bool bVar15;
  char buf [4096];
  char local_1038 [4104];
  
  uVar3 = image->numcmpts_;
  if (uVar3 == 0) {
    pcVar10 = "image must have at least one component\n";
LAB_001184dc:
    out_00 = (jas_stream_t *)0x0;
LAB_001184e1:
    out_01 = (jas_stream_t *)0x0;
    prof = (jas_iccprof_t *)0x0;
    box = (jp2_box_t *)0x0;
  }
  else {
    bVar15 = uVar3 != 1;
    if (bVar15) {
      ppjVar6 = image->cmpts_;
      iVar2 = (*ppjVar6)->sgnd_;
      pjVar13 = ppjVar6[1];
      if (pjVar13->sgnd_ == iVar2) {
        uVar12 = 2;
        do {
          if ((pjVar13->prec_ != (*ppjVar6)->prec_) || (bVar15 = uVar12 < uVar3, uVar12 == uVar3))
          break;
          pjVar13 = ppjVar6[uVar12];
          uVar12 = uVar12 + 1;
        } while (pjVar13->sgnd_ == iVar2);
      }
    }
    box = jp2_box_create(0x6a502020);
    if (box == (jp2_box_t *)0x0) {
      pcVar10 = "cannot create JP box\n";
      goto LAB_001184dc;
    }
    (box->data).ftyp.majver = 0xd0a870a;
    iVar2 = jp2_box_put(box,out);
    if (iVar2 == 0) {
      jp2_box_destroy(box);
      box = jp2_box_create(0x66747970);
      if (box == (jp2_box_t *)0x0) {
        pcVar10 = "cannot create FTYP box\n";
        goto LAB_001184dc;
      }
      (box->data).ftyp.majver = 0x6a703220;
      (box->data).ftyp.minver = 0;
      (box->data).ftyp.numcompatcodes = 1;
      (box->data).pclr.bpc = (uint_fast8_t *)0x6a703220;
      iVar2 = jp2_box_put(box,out);
      if (iVar2 != 0) {
        pcVar10 = "cannot write FTYP box\n";
        goto LAB_001184c2;
      }
      jp2_box_destroy(box);
      out_00 = jas_stream_memopen((char *)0x0,0);
      pcVar10 = "cannot create temporary stream\n";
      if (out_00 == (jas_stream_t *)0x0) goto LAB_001184dc;
      box = jp2_box_create(0x69686472);
      if (box == (jp2_box_t *)0x0) {
        pcVar10 = "cannot create IHDR box\n";
        goto LAB_001184e1;
      }
      (box->data).ftyp.majver = image->brx_ - image->tlx_;
      (box->data).bpcc.bpcs = (uint_fast8_t *)(image->bry_ - image->tly_);
      *(ulong *)((long)&box->data + 0x10) = (ulong)image->numcmpts_;
      bVar1 = 0xff;
      if (!bVar15) {
        bVar1 = (byte)((*image->cmpts_)->sgnd_ << 7) | (char)(*image->cmpts_)->prec_ - 1U & 0x7f;
      }
      (box->data).ihdr.bpc = bVar1;
      *(undefined2 *)((long)&box->data + 0x19) = 7;
      (box->data).ihdr.ipr = '\0';
      iVar2 = jp2_box_put(box,out_00);
      if (iVar2 != 0) {
        pcVar10 = "cannot write IHDR box\n";
        goto LAB_00118641;
      }
      jp2_box_destroy(box);
      if (bVar15) {
        box = jp2_box_create(0x62706363);
        if (box != (jp2_box_t *)0x0) {
          uVar3 = image->numcmpts_;
          (box->data).ftyp.majver = (ulong)uVar3;
          puVar4 = (uint_fast8_t *)jas_alloc2((ulong)uVar3,1);
          (box->data).bpcc.bpcs = puVar4;
          if (puVar4 == (uint_fast8_t *)0x0) {
            pcVar10 = "memory allocation failed\n";
          }
          else {
            if ((box->data).ftyp.majver != 0) {
              uVar5 = 0;
              do {
                (box->data).bpcc.bpcs[uVar5] =
                     (byte)(image->cmpts_[uVar5]->sgnd_ << 7) |
                     (char)image->cmpts_[uVar5]->prec_ - 1U & 0x7f;
                uVar5 = uVar5 + 1;
              } while (uVar5 < (box->data).ftyp.majver);
            }
            iVar2 = jp2_box_put(box,out_00);
            if (iVar2 == 0) {
              jp2_box_destroy(box);
              goto LAB_00118709;
            }
            pcVar10 = "cannot write BPCC box\n";
          }
          goto LAB_00118641;
        }
        pcVar10 = "cannot create BPCC box\n";
      }
      else {
LAB_00118709:
        box = jp2_box_create(0x636f6c72);
        if (box == (jp2_box_t *)0x0) {
          pcVar10 = "cannot create COLR box\n";
        }
        else {
          iVar2 = image->clrspc_;
          if (((iVar2 != 0x301) && (iVar2 != 0x501)) && (iVar2 != 0x401)) {
            *(undefined2 *)&box->data = 2;
            (box->data).colr.approx = '\0';
            if (image->cmprof_ == (jas_cmprof_t *)0x0) {
              pcVar10 = "CM profile is null\n";
LAB_00118641:
              prof = (jas_iccprof_t *)0x0;
            }
            else {
              prof = jas_iccprof_createfromcmprof(image->cmprof_);
              if (prof == (jas_iccprof_t *)0x0) {
                pcVar10 = "cannot create ICC profile\n";
                goto LAB_00118641;
              }
              out_01 = jas_stream_memopen((char *)0x0,0);
              if (out_01 != (jas_stream_t *)0x0) {
                iVar2 = jas_iccprof_save(prof,out_01);
                if (iVar2 == 0) {
                  lVar9 = jas_stream_tell(out_01);
                  uVar3 = (uint)lVar9;
                  if ((int)uVar3 < 0) {
                    pcVar10 = "cannot get stream position\n";
                  }
                  else {
                    (box->data).colr.iccplen = uVar3;
                    puVar4 = (uint_fast8_t *)jas_malloc((ulong)(uVar3 & 0x7fffffff));
                    (box->data).colr.iccp = puVar4;
                    if (puVar4 == (uint_fast8_t *)0x0) {
                      pcVar10 = "memory allocation failed\n";
                    }
                    else {
                      jas_stream_rewind(out_01);
                      iVar2 = jas_stream_read(out_01,(box->data).colr.iccp,(box->data).colr.iccplen)
                      ;
                      if (iVar2 == (box->data).colr.iccplen) {
                        jas_stream_close(out_01);
                        jas_iccprof_destroy(prof);
                        goto LAB_001187e0;
                      }
                      pcVar10 = "cannot read temporary stream\n";
                    }
                  }
                }
                else {
                  pcVar10 = "cannot write ICC profile\n";
                }
                goto LAB_001184e4;
              }
            }
            out_01 = (jas_stream_t *)0x0;
            goto LAB_001184e4;
          }
          (box->data).colr.method = '\x01';
          if (iVar2 == 0x301) {
            uVar8 = 0x11;
          }
          else {
            uVar8 = 0x10;
            if (iVar2 != 0x401) {
              if (iVar2 != 0x501) goto LAB_00118aed;
              uVar8 = 0x12;
            }
          }
          (box->data).ftyp.minver = uVar8;
          *(undefined2 *)((long)&box->data + 1) = 0;
LAB_001187e0:
          iVar2 = jp2_box_put(box,out_00);
          if (iVar2 != 0) {
            pcVar10 = "cannot write box\n";
            goto LAB_00118641;
          }
          jp2_box_destroy(box);
          iVar2 = image->clrspc_ >> 8;
          if (iVar2 == 3) {
            if (image->numcmpts_ != 0) {
              ppjVar6 = image->cmpts_;
              lVar9 = 0;
              goto LAB_00118855;
            }
LAB_00118862:
            box = jp2_box_create(0x63646566);
            if (box == (jp2_box_t *)0x0) {
              pcVar10 = "cannot create CDEF box\n";
              goto LAB_001184e1;
            }
            uVar3 = image->numcmpts_;
            (box->data).ftyp.majver = (ulong)uVar3;
            pjVar7 = (jp2_cdefchan_t *)jas_alloc2((ulong)uVar3,0x18);
            (box->data).cdef.ents = pjVar7;
            if (pjVar7 == (jp2_cdefchan_t *)0x0) {
              prof = (jas_iccprof_t *)0x0;
              out_01 = (jas_stream_t *)0x0;
              goto LAB_001184ee;
            }
            uVar3 = image->numcmpts_;
            if ((ulong)uVar3 != 0) {
              iVar2 = image->clrspc_;
              ppjVar6 = image->cmpts_;
              puVar14 = &pjVar7->assoc;
              uVar11 = 0;
              do {
                ((jp2_cdefchan_t *)(puVar14 + -2))->channo = uVar11;
                uVar8 = jp2_gettypeasoc(iVar2,(int)ppjVar6[uVar11]->type_);
                puVar14[-1] = uVar8 >> 0x10;
                *puVar14 = (ulong)((uint)uVar8 & 0x7fff);
                uVar11 = uVar11 + 1;
                puVar14 = puVar14 + 3;
              } while (uVar3 != uVar11);
            }
            iVar2 = jp2_box_put(box,out_00);
            if (iVar2 != 0) {
              pcVar10 = "cannot write CDEF box\n";
              goto LAB_00118641;
            }
            jp2_box_destroy(box);
          }
          else {
            if ((iVar2 != 5) && (iVar2 != 4)) {
LAB_00118aed:
              abort();
            }
            if (((image->numcmpts_ < 3) || (ppjVar6 = image->cmpts_, (*ppjVar6)->type_ != 0)) ||
               (ppjVar6[1]->type_ != 1)) goto LAB_00118862;
            ppjVar6 = ppjVar6 + 2;
            lVar9 = 2;
LAB_00118855:
            if ((*ppjVar6)->type_ != lVar9) goto LAB_00118862;
          }
          lVar9 = jas_stream_tell(out_00);
          jas_stream_rewind(out_00);
          box = jp2_box_create(0x6a703268);
          if (box == (jp2_box_t *)0x0) {
            pcVar10 = "cannot create JP2H box\n";
          }
          else {
            box->len = lVar9 + 8;
            iVar2 = jp2_box_put(box,out);
            if (iVar2 != 0) {
              pcVar10 = "cannot write JP2H box\n";
              goto LAB_00118641;
            }
            jp2_box_destroy(box);
            iVar2 = jas_stream_copy(out,out_00,(int)lVar9);
            if (iVar2 == 0) {
              jas_stream_close(out_00);
              box = jp2_box_create(0x6a703263);
              if (box == (jp2_box_t *)0x0) {
                pcVar10 = "cannot create JP2C box\n";
              }
              else {
                box->len = 0;
                iVar2 = jp2_box_put(box,out);
                if (iVar2 != 0) {
                  pcVar10 = "cannot write JP2C box\n";
                  goto LAB_001184c2;
                }
                jp2_box_destroy(box);
                pcVar10 = "";
                if (optstr != (char *)0x0) {
                  pcVar10 = optstr;
                }
                sprintf(local_1038,"%s\n_jp2overhead=%lu\n",pcVar10,out->rwcnt_);
                iVar2 = jpc_encode(image,out,local_1038);
                if (iVar2 == 0) {
                  return 0;
                }
                pcVar10 = "jpc_encode failed\n";
              }
              goto LAB_001184dc;
            }
            pcVar10 = "cannot copy stream\n";
          }
        }
      }
      goto LAB_001184e1;
    }
    pcVar10 = "cannot write JP box\n";
LAB_001184c2:
    prof = (jas_iccprof_t *)0x0;
    out_01 = (jas_stream_t *)0x0;
    out_00 = (jas_stream_t *)0x0;
  }
LAB_001184e4:
  jas_eprintf(pcVar10);
LAB_001184ee:
  if (prof != (jas_iccprof_t *)0x0) {
    jas_iccprof_destroy(prof);
  }
  if (out_01 != (jas_stream_t *)0x0) {
    jas_stream_close(out_01);
  }
  if (box != (jp2_box_t *)0x0) {
    jp2_box_destroy(box);
  }
  if (out_00 != (jas_stream_t *)0x0) {
    jas_stream_close(out_00);
  }
  return -1;
}

Assistant:

int jp2_encode(jas_image_t *image, jas_stream_t *out, const char *optstr)
{
	jp2_box_t *box;
	jp2_ftyp_t *ftyp;
	jp2_ihdr_t *ihdr;
	jas_stream_t *tmpstream;
	int allcmptssame;
	jp2_bpcc_t *bpcc;
	long len;
	uint_fast16_t cmptno;
	jp2_colr_t *colr;
	char buf[4096];
	uint_fast32_t overhead;
	jp2_cdefchan_t *cdefchanent;
	jp2_cdef_t *cdef;
	uint_fast32_t typeasoc;
	jas_iccprof_t *iccprof;
	jas_stream_t *iccstream;
	int pos;
	int needcdef;
	int prec;
	int sgnd;

	box = 0;
	tmpstream = 0;
	iccstream = 0;
	iccprof = 0;

	if (jas_image_numcmpts(image) < 1) {
		jas_eprintf("image must have at least one component\n");
		goto error;
	}

	allcmptssame = 1;
	sgnd = jas_image_cmptsgnd(image, 0);
	prec = jas_image_cmptprec(image, 0);
	for (unsigned i = 1; i < jas_image_numcmpts(image); ++i) {
		if (jas_image_cmptsgnd(image, i) != sgnd ||
		  jas_image_cmptprec(image, i) != prec) {
			allcmptssame = 0;
			break;
		}
	}

	/* Output the signature box. */

	if (!(box = jp2_box_create(JP2_BOX_JP))) {
		jas_eprintf("cannot create JP box\n");
		goto error;
	}
	box->data.jp.magic = JP2_JP_MAGIC;
	if (jp2_box_put(box, out)) {
		jas_eprintf("cannot write JP box\n");
		goto error;
	}
	jp2_box_destroy(box);
	box = 0;

	/* Output the file type box. */

	if (!(box = jp2_box_create(JP2_BOX_FTYP))) {
		jas_eprintf("cannot create FTYP box\n");
		goto error;
	}
	ftyp = &box->data.ftyp;
	ftyp->majver = JP2_FTYP_MAJVER;
	ftyp->minver = JP2_FTYP_MINVER;
	ftyp->numcompatcodes = 1;
	ftyp->compatcodes[0] = JP2_FTYP_COMPATCODE;
	if (jp2_box_put(box, out)) {
		jas_eprintf("cannot write FTYP box\n");
		goto error;
	}
	jp2_box_destroy(box);
	box = 0;

	/*
	 * Generate the data portion of the JP2 header box.
	 * We cannot simply output the header for this box
	 * since we do not yet know the correct value for the length
	 * field.
	 */

	if (!(tmpstream = jas_stream_memopen(0, 0))) {
		jas_eprintf("cannot create temporary stream\n");
		goto error;
	}

	/* Generate image header box. */

	if (!(box = jp2_box_create(JP2_BOX_IHDR))) {
		jas_eprintf("cannot create IHDR box\n");
		goto error;
	}
	ihdr = &box->data.ihdr;
	ihdr->width = jas_image_width(image);
	ihdr->height = jas_image_height(image);
	ihdr->numcmpts = jas_image_numcmpts(image);
	ihdr->bpc = allcmptssame ? JP2_SPTOBPC(jas_image_cmptsgnd(image, 0),
	  jas_image_cmptprec(image, 0)) : JP2_IHDR_BPCNULL;
	ihdr->comptype = JP2_IHDR_COMPTYPE;
	ihdr->csunk = 0;
	ihdr->ipr = 0;
	if (jp2_box_put(box, tmpstream)) {
		jas_eprintf("cannot write IHDR box\n");
		goto error;
	}
	jp2_box_destroy(box);
	box = 0;

	/* Generate bits per component box. */

	if (!allcmptssame) {
		if (!(box = jp2_box_create(JP2_BOX_BPCC))) {
			jas_eprintf("cannot create BPCC box\n");
			goto error;
		}
		bpcc = &box->data.bpcc;
		bpcc->numcmpts = jas_image_numcmpts(image);
		if (!(bpcc->bpcs = jas_alloc2(bpcc->numcmpts,
		  sizeof(uint_fast8_t)))) {
			jas_eprintf("memory allocation failed\n");
			goto error;
		}
		for (cmptno = 0; cmptno < bpcc->numcmpts; ++cmptno) {
			bpcc->bpcs[cmptno] = JP2_SPTOBPC(jas_image_cmptsgnd(image,
			  cmptno), jas_image_cmptprec(image, cmptno));
		}
		if (jp2_box_put(box, tmpstream)) {
			jas_eprintf("cannot write BPCC box\n");
			goto error;
		}
		jp2_box_destroy(box);
		box = 0;
	}

	/* Generate color specification box. */

	if (!(box = jp2_box_create(JP2_BOX_COLR))) {
		jas_eprintf("cannot create COLR box\n");
		goto error;
	}
	colr = &box->data.colr;
	switch (jas_image_clrspc(image)) {
	case JAS_CLRSPC_SRGB:
	case JAS_CLRSPC_SYCBCR:
	case JAS_CLRSPC_SGRAY:
		colr->method = JP2_COLR_ENUM;
		colr->csid = clrspctojp2(jas_image_clrspc(image));
		colr->pri = JP2_COLR_PRI;
		colr->approx = 0;
		break;
	default:
		colr->method = JP2_COLR_ICC;
		colr->pri = JP2_COLR_PRI;
		colr->approx = 0;
		/* Ensure that cmprof_ is not null. */
		if (!jas_image_cmprof(image)) {
			jas_eprintf("CM profile is null\n");
			goto error;
		}
		if (!(iccprof = jas_iccprof_createfromcmprof(
		  jas_image_cmprof(image)))) {
			jas_eprintf("cannot create ICC profile\n");
			goto error;
		}
		if (!(iccstream = jas_stream_memopen(0, 0))) {
			jas_eprintf("cannot create temporary stream\n");
			goto error;
		}
		if (jas_iccprof_save(iccprof, iccstream)) {
			jas_eprintf("cannot write ICC profile\n");
			goto error;
		}
		if ((pos = jas_stream_tell(iccstream)) < 0) {
			jas_eprintf("cannot get stream position\n");
			goto error;
		}
		colr->iccplen = pos;
		if (!(colr->iccp = jas_malloc(pos))) {
			jas_eprintf("memory allocation failed\n");
			goto error;
		}
		jas_stream_rewind(iccstream);
		if (jas_stream_read(iccstream, colr->iccp, colr->iccplen) !=
		  colr->iccplen) {
			jas_eprintf("cannot read temporary stream\n");
			goto error;
		}
		jas_stream_close(iccstream);
		iccstream = 0;
		jas_iccprof_destroy(iccprof);
		iccprof = 0;
		break;
	}
	if (jp2_box_put(box, tmpstream)) {
		jas_eprintf("cannot write box\n");
		goto error;
	}
	jp2_box_destroy(box);
	box = 0;

	needcdef = 1;
	switch (jas_clrspc_fam(jas_image_clrspc(image))) {
	case JAS_CLRSPC_FAM_RGB:
		if (jas_image_numcmpts(image) >= 3 &&
		  jas_image_cmpttype(image, 0) ==
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_R) &&
		  jas_image_cmpttype(image, 1) ==
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_G) &&
		  jas_image_cmpttype(image, 2) ==
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_RGB_B))
			needcdef = 0;
		break;
	case JAS_CLRSPC_FAM_YCBCR:
		if (jas_image_numcmpts(image) >= 3 &&
		  jas_image_cmpttype(image, 0) ==
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_YCBCR_Y) &&
		  jas_image_cmpttype(image, 1) ==
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_YCBCR_CB) &&
		  jas_image_cmpttype(image, 2) ==
		  JAS_IMAGE_CT_COLOR(JAS_CLRSPC_CHANIND_YCBCR_CR))
			needcdef = 0;
		break;
	case JAS_CLRSPC_FAM_GRAY:
		if (jas_image_numcmpts(image) >= 1 &&
		  jas_image_cmpttype(image, 0) ==
		  JAS_IMAGE_CT_COLOR(JAS_IMAGE_CT_GRAY_Y))
			needcdef = 0;
		break;
	default:
		abort();
		break;
	}

	if (needcdef) {
		if (!(box = jp2_box_create(JP2_BOX_CDEF))) {
			jas_eprintf("cannot create CDEF box\n");
			goto error;
		}
		cdef = &box->data.cdef;
		cdef->numchans = jas_image_numcmpts(image);
		cdef->ents = jas_alloc2(cdef->numchans, sizeof(jp2_cdefchan_t));
		if (!cdef->ents) {
			goto error;
		}
		for (unsigned i = 0; i < jas_image_numcmpts(image); ++i) {
			cdefchanent = &cdef->ents[i];
			cdefchanent->channo = i;
			typeasoc = jp2_gettypeasoc(jas_image_clrspc(image), jas_image_cmpttype(image, i));
			cdefchanent->type = typeasoc >> 16;
			cdefchanent->assoc = typeasoc & 0x7fff;
		}
		if (jp2_box_put(box, tmpstream)) {
			jas_eprintf("cannot write CDEF box\n");
			goto error;
		}
		jp2_box_destroy(box);
		box = 0;
	}

	/* Determine the total length of the JP2 header box. */

	len = jas_stream_tell(tmpstream);
	jas_stream_rewind(tmpstream);

	/*
	 * Output the JP2 header box and all of the boxes which it contains.
	 */

	if (!(box = jp2_box_create(JP2_BOX_JP2H))) {
		jas_eprintf("cannot create JP2H box\n");
		goto error;
	}
	box->len = len + JP2_BOX_HDRLEN(false);
	if (jp2_box_put(box, out)) {
		jas_eprintf("cannot write JP2H box\n");
		goto error;
	}
	jp2_box_destroy(box);
	box = 0;

	if (jas_stream_copy(out, tmpstream, len)) {
		jas_eprintf("cannot copy stream\n");
		goto error;
	}

	jas_stream_close(tmpstream);
	tmpstream = 0;

	/*
	 * Output the contiguous code stream box.
	 */

	if (!(box = jp2_box_create(JP2_BOX_JP2C))) {
		jas_eprintf("cannot create JP2C box\n");
		goto error;
	}
	box->len = 0;
	if (jp2_box_put(box, out)) {
		jas_eprintf("cannot write JP2C box\n");
		goto error;
	}
	jp2_box_destroy(box);
	box = 0;

	/* Output the JPEG-2000 code stream. */

	overhead = jas_stream_getrwcount(out);
	sprintf(buf, "%s\n_jp2overhead=%lu\n", (optstr ? optstr : ""),
	  (unsigned long) overhead);

	if (jpc_encode(image, out, buf)) {
		jas_eprintf("jpc_encode failed\n");
		goto error;
	}

	return 0;

error:

	if (iccprof) {
		jas_iccprof_destroy(iccprof);
	}
	if (iccstream) {
		jas_stream_close(iccstream);
	}
	if (box) {
		jp2_box_destroy(box);
	}
	if (tmpstream) {
		jas_stream_close(tmpstream);
	}
	return -1;
}